

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpndrv.h
# Opt level: O0

CTcPrsNode * __thiscall CTPNIfBase::adjust_for_dyn(CTPNIfBase *this,tcpn_dyncomp_info *info)

{
  _func_int **pp_Var1;
  undefined8 in_RSI;
  CTcPrsNode *in_RDI;
  
  pp_Var1 = in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
  pp_Var1 = (_func_int **)(**(code **)(*pp_Var1 + 0x88))(pp_Var1,in_RSI);
  in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var1;
  pp_Var1 = in_RDI[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
  pp_Var1 = (_func_int **)(**(code **)(*pp_Var1 + 0x88))(pp_Var1,in_RSI);
  in_RDI[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var1;
  pp_Var1 = in_RDI[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
  pp_Var1 = (_func_int **)(**(code **)(*pp_Var1 + 0x88))(pp_Var1,in_RSI);
  in_RDI[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var1;
  return in_RDI;
}

Assistant:

class CTcPrsNode *adjust_for_dyn(const tcpn_dyncomp_info *info)
    {
        /* adjust my subexpressions */
        first_ = first_->adjust_for_dyn(info);
        second_ = second_->adjust_for_dyn(info);
        third_ = third_->adjust_for_dyn(info);

        /* return myself otherwise unchanged */
        return this;
    }